

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul,30ul,31ul,32ul,33ul,34ul,35ul,36ul,37ul,38ul,39ul,40ul,41ul,42ul,43ul,44ul,45ul,46ul,47ul,48ul,49ul>>
::
FlatTupleBase<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,undefined8 param_5
          ,undefined8 param_6,undefined8 param_7,undefined8 param_8,undefined8 param_9,
          undefined8 param_10,undefined8 param_11,undefined8 param_12,undefined8 param_13,
          undefined8 param_14,undefined8 param_15,undefined8 param_16,undefined8 param_17,
          undefined8 param_18,undefined8 this,undefined8 param_20,undefined8 param_21,
          undefined8 param_22,undefined8 param_23,undefined8 param_24,undefined8 param_25,
          undefined8 param_26,undefined8 param_27,undefined8 param_28,undefined8 param_29,
          undefined8 param_30,undefined8 param_31,undefined8 param_32,undefined8 param_33,
          undefined8 param_34,undefined8 param_35,undefined8 param_36,undefined8 param_37,
          undefined8 param_38,undefined8 param_39,undefined8 param_40,undefined8 param_41,
          undefined8 param_42,undefined8 param_43,undefined8 param_44,undefined8 param_45,
          undefined8 param_46,undefined8 param_47,undefined8 param_48,undefined8 param_49,
          undefined8 param_50,undefined8 param_51)

{
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,0ul>
  ::FlatTupleElemBase<std::tuple<int,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_0UL>
              *)param_1,param_2);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,1ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_1UL>
              *)((long)param_1 + 8),param_3);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,2ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_2UL>
              *)((long)param_1 + 0x18),param_4);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,3ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_3UL>
              *)((long)param_1 + 0x28),param_5);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,4ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_4UL>
              *)((long)param_1 + 0x38),param_6);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,5ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_5UL>
              *)((long)param_1 + 0x48),param_7);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,6ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_6UL>
              *)((long)param_1 + 0x58),param_8);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,7ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_7UL>
              *)((long)param_1 + 0x68),param_9);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,8ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_8UL>
              *)((long)param_1 + 0x78),param_10);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,9ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_9UL>
              *)((long)param_1 + 0x88),param_11);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,10ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_10UL>
              *)((long)param_1 + 0x98),param_12);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,11ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_11UL>
              *)((long)param_1 + 0xa8),param_13);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,12ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_12UL>
              *)((long)param_1 + 0xb8),param_14);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,13ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_13UL>
              *)((long)param_1 + 200),param_15);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,14ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_14UL>
              *)((long)param_1 + 0xd8),param_16);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,15ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_15UL>
              *)((long)param_1 + 0xe8),param_17);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,16ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_16UL>
              *)((long)param_1 + 0xf8),param_18);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,17ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_17UL>
              *)((long)param_1 + 0x108),this);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,18ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_18UL>
              *)((long)param_1 + 0x118),param_20);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,19ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_19UL>
              *)((long)param_1 + 0x128),param_21);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,20ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_20UL>
              *)((long)param_1 + 0x138),param_22);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,21ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_21UL>
              *)((long)param_1 + 0x148),param_23);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,22ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_22UL>
              *)((long)param_1 + 0x158),param_24);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,23ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_23UL>
              *)((long)param_1 + 0x168),param_25);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,24ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_24UL>
              *)((long)param_1 + 0x178),param_26);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,25ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_25UL>
              *)((long)param_1 + 0x188),param_27);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,26ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_26UL>
              *)((long)param_1 + 0x198),param_28);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,27ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_27UL>
              *)((long)param_1 + 0x1a8),param_29);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,28ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_28UL>
              *)((long)param_1 + 0x1b8),param_30);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,29ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_29UL>
              *)((long)param_1 + 0x1c8),param_31);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,30ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_30UL>
              *)((long)param_1 + 0x1d8),param_32);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,31ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_31UL>
              *)((long)param_1 + 0x1e8),param_33);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,32ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_32UL>
              *)((long)param_1 + 0x1f8),param_34);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,33ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_33UL>
              *)((long)param_1 + 0x208),param_35);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,34ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_34UL>
              *)((long)param_1 + 0x218),param_36);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,35ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_35UL>
              *)((long)param_1 + 0x228),param_37);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,36ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_36UL>
              *)((long)param_1 + 0x238),param_38);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,37ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_37UL>
              *)((long)param_1 + 0x248),param_39);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,38ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_38UL>
              *)((long)param_1 + 600),param_40);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,39ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_39UL>
              *)((long)param_1 + 0x268),param_41);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,40ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_40UL>
              *)((long)param_1 + 0x278),param_42);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,41ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_41UL>
              *)((long)param_1 + 0x288),param_43);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,42ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_42UL>
              *)((long)param_1 + 0x298),param_44);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,43ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_43UL>
              *)((long)param_1 + 0x2a8),param_45);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,44ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_44UL>
              *)((long)param_1 + 0x2b8),param_46);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,45ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_45UL>
              *)((long)param_1 + 0x2c8),param_47);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,46ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_46UL>
              *)((long)param_1 + 0x2d8),param_48);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,47ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_47UL>
              *)((long)param_1 + 0x2e8),param_49);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,48ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_48UL>
              *)((long)param_1 + 0x2f8),param_50);
  FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>,49ul>
  ::FlatTupleElemBase<std::tuple<long,int>>
            ((FlatTupleElemBase<testing::internal::FlatTuple<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>,_49UL>
              *)((long)param_1 + 0x308),param_51);
  return;
}

Assistant:

explicit FlatTupleBase(FlatTupleConstructTag, Args&&... args)
      : FlatTupleElemBase<FlatTuple<T...>, Idx>(FlatTupleConstructTag{},
                                                std::forward<Args>(args))... {}